

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_2_5::TiledInputFile::levelWidth(TiledInputFile *this,int lx)

{
  int iVar1;
  stringstream _iex_replace_s;
  BaseExc *e;
  LevelRoundingMode in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  
  iVar1 = levelSize(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                    in_stack_fffffffffffffe28);
  return iVar1;
}

Assistant:

int
TiledInputFile::levelWidth (int lx) const
{
    try
    {
        return levelSize (_data->minX, _data->maxX, lx,
			  _data->tileDesc.roundingMode);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling levelWidth() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}